

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O2

bool __thiscall
spvtools::EnumSet<spv::Capability>::HasAnyOf
          (EnumSet<spv::Capability> *this,EnumSet<spv::Capability> *in_set)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  
  if (in_set->size_ == 0) {
    return true;
  }
  pBVar1 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (in_set->buckets_).
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    bVar3 = pBVar2 == (in_set->buckets_).
                      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar3) {
      return false;
    }
    while( true ) {
      if (pBVar1 == (this->buckets_).
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        return false;
      }
      if (pBVar1->start == pBVar2->start) break;
      if (pBVar2->start <= pBVar1->start) goto LAB_001934ce;
      pBVar1 = pBVar1 + 1;
    }
    if ((pBVar1->data & pBVar2->data) != 0) {
      return !bVar3;
    }
    pBVar1 = pBVar1 + 1;
LAB_001934ce:
    pBVar2 = pBVar2 + 1;
  } while( true );
}

Assistant:

inline bool empty() const { return size_ == 0; }